

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O2

void __thiscall
Node::OutputVirtualList
          (Node *this,ostream *os,Node *Channel,Node *MainType,int ExtType,int GlobalStat)

{
  ostream *poVar1;
  string sStack_78;
  VariableStruct *local_58;
  string local_50;
  
  for (; this->Type == 0x1f5; this = this->Tree[1]) {
    OutputVirtualList(this->Tree[0],os,Channel,MainType,ExtType,GlobalStat);
  }
  local_58 = VariableList::Lookup(Variables,&this->Tree[0]->TextValue,this->Tree[2],0);
  Indent_abi_cxx11_(&sStack_78,this);
  poVar1 = std::operator<<(os,(string *)&sStack_78);
  poVar1 = std::operator<<(poVar1,"VirtualArray<");
  OutputNodeVarType_abi_cxx11_(&local_50,this->Tree[1]);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,"> ");
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&sStack_78);
  if (local_58 == (VariableStruct *)0x0) {
    genname(&sStack_78,&this->Tree[0]->TextValue);
    poVar1 = std::operator<<(os,(string *)&sStack_78);
    std::operator<<(poVar1,"(");
  }
  else {
    VariableStruct::GetName_abi_cxx11_(&sStack_78,local_58,0);
    poVar1 = std::operator<<(os,(string *)&sStack_78);
    std::operator<<(poVar1,"(");
  }
  std::__cxx11::string::~string((string *)&sStack_78);
  Expression_abi_cxx11_(&sStack_78,Channel);
  poVar1 = std::operator<<(os,(string *)&sStack_78);
  poVar1 = std::operator<<(poVar1,", ");
  Expression_abi_cxx11_(&local_50,this->Tree[2]);
  std::operator<<(poVar1,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&sStack_78);
  if (this->Tree[3] != (Node *)0x0) {
    poVar1 = std::operator<<(os,", ");
    Expression_abi_cxx11_(&sStack_78,this->Tree[3]);
    std::operator<<(poVar1,(string *)&sStack_78);
    std::__cxx11::string::~string((string *)&sStack_78);
  }
  poVar1 = std::operator<<(os,");");
  std::endl<char,std::char_traits<char>>(poVar1);
  if (this->Block[0] != (Node *)0x0) {
    OutputVirtualList(this->Block[0],os,Channel,MainType,ExtType,GlobalStat);
  }
  return;
}

Assistant:

void Node::OutputVirtualList(
	std::ostream& os,	/**< iostream to write C++ code */
	Node* Channel,		/**< IO channe to use */
	Node* MainType,		/**< Main stat type */
	int ExtType,		/**< Extra data type */
	int GlobalStat		/**< Global status */
)
{
	VariableStruct *ThisVar;

	switch(Type)
	{
	case BAS_N_LIST:

		//
		// Put multiple items on seperate lines
		//
		Tree[0]->OutputVirtualList(os, Channel, MainType, ExtType);
		Tree[1]->OutputVirtualList(os, Channel, MainType, ExtType);

		break;

	default:
		//
		// Look for variable in table
		//
		ThisVar = Variables->Lookup(Tree[0]->TextValue, Tree[2]);

		os << Indent() <<
			"VirtualArray<" <<
			Tree[1]->OutputNodeVarType() << "> ";

		if (ThisVar != 0)
		{
			os << ThisVar->GetName() << "(";
		}
		else
		{
			os << genname(Tree[0]->TextValue) << "(";
		}
		os << Channel->Expression() << ", " << Tree[2]->Expression();

		if (Tree[3] != 0)
		{
			os << ", " << Tree[3]->Expression();
		}
		os << ");" << std::endl;

		if (Block[0] != 0)
		{
			Block[0]->OutputVirtualList(os, Channel, MainType, ExtType);
		}
		break;

	}
}